

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void statement_identifier(ch_compilation *comp)

{
  ch_compilation *comp_local;
  
  advance(comp);
  identifier(comp,true);
  return;
}

Assistant:

void statement_identifier(ch_compilation *comp) {
  /*
      Ensure that we're invoking the variable

      Tolerated:
      print(x);
      Not tolerated:
      print;
  */
  advance(comp); // identifier() expects the TK_ID to already be processed
  identifier(comp, true);
}